

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_unmark_rec(mddnode_t node)

{
  int iVar1;
  uint64_t uVar2;
  mddnode_t pmVar3;
  MDD node_down;
  MDD node_right;
  mddnode_t node_local;
  
  iVar1 = lddmc_unmark(node);
  if (iVar1 != 0) {
    uVar2 = mddnode_getright(node);
    if (1 < uVar2) {
      pmVar3 = LDD_GETNODE(uVar2);
      lddmc_unmark_rec(pmVar3);
    }
    uVar2 = mddnode_getdown(node);
    if (1 < uVar2) {
      pmVar3 = LDD_GETNODE(uVar2);
      lddmc_unmark_rec(pmVar3);
    }
  }
  return;
}

Assistant:

static void
lddmc_unmark_rec(mddnode_t node)
{
    if (lddmc_unmark(node)) {
        MDD node_right = mddnode_getright(node);
        if (node_right > lddmc_true) lddmc_unmark_rec(LDD_GETNODE(node_right));
        MDD node_down = mddnode_getdown(node);
        if (node_down > lddmc_true) lddmc_unmark_rec(LDD_GETNODE(node_down));
    }
}